

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O0

int gost_imit_update(EVP_MD_CTX *ctx,void *data,size_t count)

{
  long lVar1;
  ulong in_RDX;
  uchar *in_RSI;
  undefined8 in_RDI;
  size_t i;
  size_t bytes;
  uchar *p;
  ossl_gost_imit_ctx *c;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  ossl_gost_imit_ctx *in_stack_ffffffffffffffc0;
  ulong local_38;
  uchar *local_30;
  int local_4;
  
  lVar1 = EVP_MD_CTX_get0_md_data(in_RDI);
  if (*(int *)(lVar1 + 0x107c) == 0) {
    ERR_GOST_error((int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),(int)in_stack_ffffffffffffffc0,
                   (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),0);
    local_4 = 0;
  }
  else {
    local_38 = in_RDX;
    local_30 = in_RSI;
    if (*(int *)(lVar1 + 0x1078) != 0) {
      for (in_stack_ffffffffffffffc0 = (ossl_gost_imit_ctx *)(long)*(int *)(lVar1 + 0x1078);
          in_stack_ffffffffffffffbf =
               in_stack_ffffffffffffffc0 < (ossl_gost_imit_ctx *)0x8 && local_38 != 0,
          in_stack_ffffffffffffffc0 < (ossl_gost_imit_ctx *)0x8 && local_38 != 0;
          in_stack_ffffffffffffffc0 =
               (ossl_gost_imit_ctx *)((long)(in_stack_ffffffffffffffc0->cctx).master_key + 1)) {
        in_stack_ffffffffffffffc0->partial_block[lVar1] = *local_30;
        local_38 = local_38 - 1;
        local_30 = local_30 + 1;
      }
      if (in_stack_ffffffffffffffc0 != (ossl_gost_imit_ctx *)0x8) {
        *(int *)(lVar1 + 0x1078) = (int)in_stack_ffffffffffffffc0;
        return 1;
      }
      mac_block_mesh((ossl_gost_imit_ctx *)0x8,
                     (uchar *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    }
    for (; 8 < local_38; local_38 = local_38 - 8) {
      mac_block_mesh(in_stack_ffffffffffffffc0,
                     (uchar *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
      local_30 = local_30 + 8;
    }
    if (local_38 != 0) {
      memcpy((void *)(lVar1 + 0x1068),local_30,local_38);
    }
    *(int *)(lVar1 + 0x1078) = (int)local_38;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int gost_imit_update(EVP_MD_CTX *ctx, const void *data, size_t count)
{
    struct ossl_gost_imit_ctx *c = EVP_MD_CTX_md_data(ctx);
    const unsigned char *p = data;
    size_t bytes = count;
    if (!(c->key_set)) {
        GOSTerr(GOST_F_GOST_IMIT_UPDATE, GOST_R_MAC_KEY_NOT_SET);
        return 0;
    }
    if (c->bytes_left) {
        size_t i;
        for (i = c->bytes_left; i < 8 && bytes > 0; bytes--, i++, p++) {
            c->partial_block[i] = *p;
        }
        if (i == 8) {
            mac_block_mesh(c, c->partial_block);
        } else {
            c->bytes_left = i;
            return 1;
        }
    }
    while (bytes > 8) {
        mac_block_mesh(c, p);
        p += 8;
        bytes -= 8;
    }
    if (bytes > 0) {
        memcpy(c->partial_block, p, bytes);
    }
    c->bytes_left = bytes;
    return 1;
}